

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void PeleLM::Initialize_specific(void)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int *piVar4;
  Geometry *pGVar5;
  ostream *poVar6;
  pointer pRVar7;
  int reactType;
  int nCell;
  int dir_2;
  int dir_1;
  int i;
  int dir;
  bool flag_closed_chamber;
  Vector<int,_std::allocator<int>_> hi_bc;
  Vector<int,_std::allocator<int>_> lo_bc;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hi_bc_char;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lo_bc_char;
  ParmParse pplm;
  size_type in_stack_fffffffffffffdd8;
  Geometry *in_stack_fffffffffffffde0;
  unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
  *this;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  ParmParse *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe50;
  string *ptr;
  char *in_stack_fffffffffffffe58;
  char *name;
  double *in_stack_fffffffffffffe60;
  ParmParse *this_00;
  char *in_stack_fffffffffffffe68;
  char *name_00;
  ParmParse *this_01;
  unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
  local_180;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  byte local_162;
  string local_161;
  char local_141 [49];
  char *in_stack_fffffffffffffef0;
  ParmParse *in_stack_fffffffffffffef8;
  undefined1 local_d1 [121];
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *in_stack_ffffffffffffffc8;
  
  (anonymous_namespace)::num_deltaT_iters_MAX = 10;
  (anonymous_namespace)::deltaT_norm_max = 0x3ddb7cdfd9d7bdbb;
  (anonymous_namespace)::num_forkjoin_tasks = 1;
  (anonymous_namespace)::forkjoin_verbose = 0;
  this_01 = (ParmParse *)local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_d1 + 1),"peleLM",(allocator *)this_01);
  amrex::ParmParse::ParmParse
            (in_stack_fffffffffffffdf0,
             (string *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  std::__cxx11::string::~string((string *)(local_d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d1);
  amrex::ParmParse::query
            (this_01,in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  amrex::ParmParse::query
            (this_01,in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  amrex::ParmParse::query
            (this_01,in_stack_fffffffffffffe68,(bool *)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  amrex::ParmParse::query
            (this_01,in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  amrex::ParmParse::query
            (this_01,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  amrex::ParmParse::query
            (this_01,in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  amrex::ParmParse::query
            (this_01,in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  amrex::ParmParse::query
            (this_01,in_stack_fffffffffffffe68,(bool *)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  amrex::ParmParse::query
            (this_01,in_stack_fffffffffffffe68,(bool *)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  name_00 = &stack0xfffffffffffffeff;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x287bc3);
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(allocator_type *)0x287bdd);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x287bec);
  this_00 = (ParmParse *)(local_141 + 0x20);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x287c01);
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(allocator_type *)0x287c1b);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x287c2a);
  amrex::ParmParse::getarr
            (this_00,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
             in_stack_fffffffffffffe48);
  amrex::ParmParse::getarr
            (this_00,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
             in_stack_fffffffffffffe48);
  name = local_141;
  std::allocator<int>::allocator((allocator<int> *)0x287c8b);
  amrex::Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8,(allocator_type *)0x287ca5);
  std::allocator<int>::~allocator((allocator<int> *)0x287cb4);
  ptr = &local_161;
  std::allocator<int>::allocator((allocator<int> *)0x287cc6);
  amrex::Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8,(allocator_type *)0x287cdd);
  std::allocator<int>::~allocator((allocator<int> *)0x287cec);
  local_162 = 0;
  for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
    pbVar3 = amrex::
             Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    iVar2 = std::__cxx11::string::compare((char *)pbVar3);
    if (iVar2 == 0) {
      piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffdd8);
      *piVar4 = 0;
    }
    else {
      pbVar3 = amrex::
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      if (iVar2 == 0) {
        piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                            in_stack_fffffffffffffdd8);
        *piVar4 = 1;
        local_162 = 1;
      }
      else {
        pbVar3 = amrex::
                 Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
        if (iVar2 == 0) {
          piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                              in_stack_fffffffffffffdd8);
          *piVar4 = 2;
          local_162 = 1;
        }
        else {
          pbVar3 = amrex::
                   Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          iVar2 = std::__cxx11::string::compare((char *)pbVar3);
          if (iVar2 == 0) {
            piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                               ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                                in_stack_fffffffffffffdd8);
            *piVar4 = 3;
          }
          else {
            pbVar3 = amrex::
                     Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
            iVar2 = std::__cxx11::string::compare((char *)pbVar3);
            if (iVar2 == 0) {
              piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                                 ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                                  in_stack_fffffffffffffdd8);
              *piVar4 = 4;
            }
            else {
              pbVar3 = amrex::
                       Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
              iVar2 = std::__cxx11::string::compare((char *)pbVar3);
              if (iVar2 == 0) {
                piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                                   ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                                    in_stack_fffffffffffffdd8);
                *piVar4 = 5;
              }
              else {
                pbVar3 = amrex::
                         Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
                iVar2 = std::__cxx11::string::compare((char *)pbVar3);
                if (iVar2 == 0) {
                  piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                                     ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0
                                      ,in_stack_fffffffffffffdd8);
                  *piVar4 = 6;
                }
                else {
                  pbVar3 = amrex::
                           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
                  iVar2 = std::__cxx11::string::compare((char *)pbVar3);
                  if (iVar2 == 0) {
                    piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                                       ((Vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
                    *piVar4 = 7;
                  }
                  else {
                    amrex::Abort_host((char *)in_stack_fffffffffffffdf0);
                  }
                }
              }
            }
          }
        }
      }
    }
    pbVar3 = amrex::
             Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    iVar2 = std::__cxx11::string::compare((char *)pbVar3);
    if (iVar2 == 0) {
      piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffdd8);
      *piVar4 = 0;
    }
    else {
      pbVar3 = amrex::
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      if (iVar2 == 0) {
        piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                            in_stack_fffffffffffffdd8);
        *piVar4 = 1;
        local_162 = 1;
      }
      else {
        pbVar3 = amrex::
                 Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
        if (iVar2 == 0) {
          piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                              in_stack_fffffffffffffdd8);
          *piVar4 = 2;
          local_162 = 1;
        }
        else {
          pbVar3 = amrex::
                   Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          iVar2 = std::__cxx11::string::compare((char *)pbVar3);
          if (iVar2 == 0) {
            piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                               ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                                in_stack_fffffffffffffdd8);
            *piVar4 = 3;
          }
          else {
            pbVar3 = amrex::
                     Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
            iVar2 = std::__cxx11::string::compare((char *)pbVar3);
            if (iVar2 == 0) {
              piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                                 ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                                  in_stack_fffffffffffffdd8);
              *piVar4 = 4;
            }
            else {
              pbVar3 = amrex::
                       Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
              iVar2 = std::__cxx11::string::compare((char *)pbVar3);
              if (iVar2 == 0) {
                piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                                   ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                                    in_stack_fffffffffffffdd8);
                *piVar4 = 5;
              }
              else {
                pbVar3 = amrex::
                         Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
                iVar2 = std::__cxx11::string::compare((char *)pbVar3);
                if (iVar2 == 0) {
                  piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                                     ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0
                                      ,in_stack_fffffffffffffdd8);
                  *piVar4 = 6;
                }
                else {
                  pbVar3 = amrex::
                           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
                  iVar2 = std::__cxx11::string::compare((char *)pbVar3);
                  if (iVar2 == 0) {
                    piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                                       ((Vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
                    *piVar4 = 7;
                  }
                  else {
                    amrex::Abort_host((char *)in_stack_fffffffffffffdf0);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  for (local_16c = 0; local_16c < 3; local_16c = local_16c + 1) {
    iVar2 = local_16c;
    piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                        in_stack_fffffffffffffdd8);
    NavierStokesBase::phys_bc.bc[iVar2] = *piVar4;
    in_stack_fffffffffffffe4c = local_16c;
    piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                        in_stack_fffffffffffffdd8);
    NavierStokesBase::phys_bc.bc[in_stack_fffffffffffffe4c + 3] = *piVar4;
  }
  NavierStokesBase::read_geometry();
  amrex::DefaultGeometry();
  bVar1 = amrex::Geometry::isAnyPeriodic(in_stack_fffffffffffffde0);
  if (bVar1) {
    for (local_170 = 0; local_170 < 3; local_170 = local_170 + 1) {
      pGVar5 = amrex::DefaultGeometry();
      bVar1 = amrex::Geometry::isPeriodic(pGVar5,local_170);
      if (bVar1) {
        piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                            in_stack_fffffffffffffdd8);
        if (*piVar4 != 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "PeleLM::variableSetUp:periodic in direction ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_170);
          std::operator<<(poVar6," but low BC is not Interior\n");
          in_stack_ffffffffffffffc8 = "PeleLM::Initialize()";
          amrex::Abort_host((char *)in_stack_fffffffffffffdf0);
        }
        piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                            in_stack_fffffffffffffdd8);
        if (*piVar4 != 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "PeleLM::variableSetUp:periodic in direction ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_170);
          std::operator<<(poVar6," but high BC is not Interior\n");
          local_40 = "PeleLM::Initialize()";
          amrex::Abort_host((char *)in_stack_fffffffffffffdf0);
        }
      }
    }
  }
  for (local_174 = 0; local_174 < 3; local_174 = local_174 + 1) {
    pGVar5 = amrex::DefaultGeometry();
    bVar1 = amrex::Geometry::isPeriodic(pGVar5,local_174);
    if (!bVar1) {
      piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffdd8);
      if (*piVar4 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "PeleLM::variableSetUp:Interior bc in direction ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_174);
        std::operator<<(poVar6," but not defined as periodic\n");
        local_48 = "PeleLM::Initialize()";
        amrex::Abort_host((char *)in_stack_fffffffffffffdf0);
      }
      piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffdd8);
      if (*piVar4 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "PeleLM::variableSetUp:Interior bc in direction ");
        in_stack_fffffffffffffdf0 = (ParmParse *)std::ostream::operator<<(poVar6,local_174);
        std::operator<<((ostream *)in_stack_fffffffffffffdf0," but not defined as periodic\n");
        local_50 = "PeleLM::Initialize()";
        amrex::Abort_host((char *)in_stack_fffffffffffffdf0);
      }
    }
  }
  closed_chamber = (int)((local_162 & 1) == 0);
  dpdt_factor = 1.0;
  amrex::ParmParse::query(this_01,name_00,(double *)this_00,(int)((ulong)name >> 0x20));
  bVar1 = amrex::ParmParse::contains(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if (!bVar1) {
    local_58 = "  peleLM.chem_integrator need to be specified";
    amrex::Abort_host((char *)in_stack_fffffffffffffdf0);
  }
  amrex::ParmParse::get(this_00,name,ptr,in_stack_fffffffffffffe4c);
  pele::physics::Factory<pele::physics::reactions::ReactorBase>::create
            ((string *)in_stack_ffffffffffffffc8);
  this = &m_reactor;
  std::
  unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
  ::operator=(&m_reactor,&local_180);
  std::
  unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
  ::~unique_ptr(this);
  pRVar7 = std::
           unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
           ::operator->((unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                         *)0x288843);
  (*(pRVar7->super_Factory<pele::physics::reactions::ReactorBase>)._vptr_Factory[2])(pRVar7,2,1);
  amrex::Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x288868);
  amrex::Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x288875);
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x288882);
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x28888f);
  amrex::ParmParse::~ParmParse((ParmParse *)0x28889c);
  return;
}

Assistant:

void
PeleLM::Initialize_specific ()
{

    num_deltaT_iters_MAX    = 10;
    deltaT_norm_max         = 1.e-10;
    num_forkjoin_tasks      = 1;
    forkjoin_verbose        = false;

    ParmParse pplm("peleLM");

    // Number of species in group for multi-component solves
    pplm.query("speciesGroupSize",nSpecGroup);

    pplm.query("num_forkjoin_tasks",num_forkjoin_tasks);
    pplm.query("forkjoin_verbose",forkjoin_verbose);
    pplm.query("num_deltaT_iters_MAX",num_deltaT_iters_MAX);
    pplm.query("deltaT_norm_max",deltaT_norm_max);
    pplm.query("deltaT_verbose",deltaT_verbose);
    pplm.query("deltaT_crashOnConvFail",deltaT_crashOnConvFail);

    pplm.query("use_typ_vals_chem",use_typ_vals_chem);
    pplm.query("harm_avg_cen2edge", def_harm_avg_cen2edge);

    // Get boundary conditions
    Vector<std::string> lo_bc_char(AMREX_SPACEDIM);
    Vector<std::string> hi_bc_char(AMREX_SPACEDIM);
    pplm.getarr("lo_bc",lo_bc_char,0,AMREX_SPACEDIM);
    pplm.getarr("hi_bc",hi_bc_char,0,AMREX_SPACEDIM);


    Vector<int> lo_bc(AMREX_SPACEDIM), hi_bc(AMREX_SPACEDIM);
    bool flag_closed_chamber = false;
    for (int dir = 0; dir<AMREX_SPACEDIM; dir++){
      if (!lo_bc_char[dir].compare("Interior")){
        lo_bc[dir] = 0;
      } else if (!lo_bc_char[dir].compare("Inflow")){
        lo_bc[dir] = 1;
        flag_closed_chamber = true;
      } else if (!lo_bc_char[dir].compare("Outflow")){
        lo_bc[dir] = 2;
        flag_closed_chamber = true;
      } else if (!lo_bc_char[dir].compare("Symmetry")){
        lo_bc[dir] = 3;
      } else if (!lo_bc_char[dir].compare("SlipWallAdiab")){
        lo_bc[dir] = 4;
      } else if (!lo_bc_char[dir].compare("NoSlipWallAdiab")){
        lo_bc[dir] = 5;
      } else if (!lo_bc_char[dir].compare("SlipWallIsotherm")){
        lo_bc[dir] = 6;
      } else if (!lo_bc_char[dir].compare("NoSlipWallIsotherm")){
        lo_bc[dir] = 7;
      } else {
        amrex::Abort("Wrong boundary condition word in lo_bc, please use: Interior, Inflow, Outflow, "
                     "Symmetry, SlipWallAdiab, NoSlipWallAdiab, SlipWallIsotherm, NoSlipWallIsotherm");
      }

      if (!hi_bc_char[dir].compare("Interior")){
        hi_bc[dir] = 0;
      } else if (!hi_bc_char[dir].compare("Inflow")){
        hi_bc[dir] = 1;
        flag_closed_chamber = true;
      } else if (!hi_bc_char[dir].compare("Outflow")){
        hi_bc[dir] = 2;
        flag_closed_chamber = true;
      } else if (!hi_bc_char[dir].compare("Symmetry")){
        hi_bc[dir] = 3;
      } else if (!hi_bc_char[dir].compare("SlipWallAdiab")){
        hi_bc[dir] = 4;
      } else if (!hi_bc_char[dir].compare("NoSlipWallAdiab")){
        hi_bc[dir] = 5;
      } else if (!hi_bc_char[dir].compare("SlipWallIsotherm")){
        hi_bc[dir] = 6;
      } else if (!hi_bc_char[dir].compare("NoSlipWallIsotherm")){
        hi_bc[dir] = 7;
      } else {
        amrex::Abort("Wrong boundary condition word in hi_bc, please use: Interior, UserBC, Symmetry, SlipWall, NoSlipWall");
      }
    }

    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        phys_bc.setLo(i,lo_bc[i]);
        phys_bc.setHi(i,hi_bc[i]);
    }

    read_geometry();
    //
    // Check phys_bc against possible periodic geometry
    // if periodic, must have internal BC marked.
    //
    if (DefaultGeometry().isAnyPeriodic())
    {
        //
        // Do idiot check.  Periodic means interior in those directions.
        //
        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
        {
            if (DefaultGeometry().isPeriodic(dir))
            {
                if (lo_bc[dir] != Interior)
                {
                    std::cerr << "PeleLM::variableSetUp:periodic in direction "
                              << dir
                              << " but low BC is not Interior\n";
                    amrex::Abort("PeleLM::Initialize()");
                }
                if (hi_bc[dir] != Interior)
                {
                    std::cerr << "PeleLM::variableSetUp:periodic in direction "
                              << dir
                              << " but high BC is not Interior\n";
                    amrex::Abort("PeleLM::Initialize()");
                }
            }
        }
    }

    {
        //
        // Do idiot check.  If not periodic, should be no interior.
        //
        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
        {
            if (!DefaultGeometry().isPeriodic(dir))
            {
              if (lo_bc[dir] == Interior)
              {
                  std::cerr << "PeleLM::variableSetUp:Interior bc in direction "
                            << dir
                            << " but not defined as periodic\n";
                  amrex::Abort("PeleLM::Initialize()");
              }
              if (hi_bc[dir] == Interior)
              {
                  std::cerr << "PeleLM::variableSetUp:Interior bc in direction "
                            << dir
                            << " but not defined as periodic\n";
                  amrex::Abort("PeleLM::Initialize()");
              }
            }
        }
    }

   PeleLM::closed_chamber  = 1;
   if (flag_closed_chamber){
      PeleLM::closed_chamber  = 0;
   }

   PeleLM::dpdt_factor = 1.0;
   pplm.query("dpdt_factor",dpdt_factor);

   // Initialize reactor: TODO might do a per level ?
   if (!pplm.contains("chem_integrator")) {
      Abort("  peleLM.chem_integrator need to be specified");
   }
   pplm.get("chem_integrator",chem_integrator);
   m_reactor = pele::physics::reactions::ReactorBase::create(chem_integrator);
   const int nCell = 1;
   const int reactType = 2;
   m_reactor->init(reactType, nCell);
}